

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

mp_int * ssh_rsakex_decrypt(RSAKey *rsa,ssh_hashalg *h,ptrlen ciphertext)

{
  uint8_t uVar1;
  uint datalen;
  int iVar2;
  int iVar3;
  size_t sVar4;
  mp_int *pmVar5;
  mp_int *x;
  char *ptr;
  ptrlen pVar6;
  undefined1 local_c8 [4];
  int HLEN;
  BinarySource src [1];
  undefined1 local_98 [8];
  uchar labelhash [64];
  uchar *out;
  int i;
  int outlen;
  mp_int *b2;
  mp_int *b1;
  ssh_hashalg *h_local;
  RSAKey *rsa_local;
  ptrlen ciphertext_local;
  
  datalen = (uint)h->hlen;
  sVar4 = mp_get_nbits(rsa->modulus);
  iVar2 = (int)(sVar4 + 7 >> 3);
  if (ciphertext.len == (long)iVar2) {
    pmVar5 = mp_from_bytes_be(ciphertext);
    x = rsa_privkey_op(pmVar5,rsa);
    ptr = (char *)safemalloc((long)iVar2,1,0);
    for (out._0_4_ = 0; (int)out < iVar2; out._0_4_ = (int)out + 1) {
      uVar1 = mp_get_byte(x,(long)((iVar2 + -1) - (int)out));
      ptr[(int)out] = uVar1;
    }
    mp_free(pmVar5);
    mp_free(x);
    oaep_mask(h,ptr + (long)(int)datalen + 1,(iVar2 - datalen) + -1,ptr + 1,datalen);
    oaep_mask(h,ptr + 1,datalen,ptr + (long)(int)datalen + 1,(iVar2 - datalen) + -1);
    if (*ptr == '\0') {
      if (0x40 < datalen) {
        __assert_fail("HLEN <= lenof(labelhash)",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                      ,0x43e,"mp_int *ssh_rsakex_decrypt(RSAKey *, const ssh_hashalg *, ptrlen)");
      }
      pVar6 = make_ptrlen("",0);
      hash_simple(h,pVar6,local_98);
      iVar3 = memcmp(ptr + (long)(int)datalen + 1,local_98,(long)(int)datalen);
      if (iVar3 == 0) {
        iVar3 = datalen * 2;
        do {
          out._0_4_ = iVar3 + 1;
          if (iVar2 <= (int)out) {
LAB_00192799:
            pVar6 = make_ptrlen(ptr + (int)out,(long)(iVar2 - (int)out));
            BinarySource_INIT__((BinarySource *)local_c8,pVar6);
            pmVar5 = BinarySource_get_mp_ssh2((BinarySource *)src[0]._24_8_);
            safefree(ptr);
            if ((*(int *)(src[0]._24_8_ + 0x18) == 0) &&
               (*(long *)(src[0]._24_8_ + 0x10) == *(long *)(src[0]._24_8_ + 8))) {
              return pmVar5;
            }
            mp_free(pmVar5);
            return (mp_int *)0x0;
          }
          if (ptr[(int)out] == '\x01') {
            out._0_4_ = iVar3 + 2;
            goto LAB_00192799;
          }
          iVar3 = (int)out;
        } while (ptr[(int)out] == '\0');
        safefree(ptr);
      }
      else {
        safefree(ptr);
      }
    }
    else {
      safefree(ptr);
    }
  }
  return (mp_int *)0x0;
}

Assistant:

mp_int *ssh_rsakex_decrypt(
    RSAKey *rsa, const ssh_hashalg *h, ptrlen ciphertext)
{
    mp_int *b1, *b2;
    int outlen, i;
    unsigned char *out;
    unsigned char labelhash[64];
    BinarySource src[1];
    const int HLEN = h->hlen;

    /*
     * Decryption side of the RSA key exchange operation.
     */

    /* The length of the encrypted data should be exactly the length
     * in octets of the RSA modulus.. */
    outlen = (7 + mp_get_nbits(rsa->modulus)) / 8;
    if (ciphertext.len != outlen)
        return NULL;

    /* Do the RSA decryption, and extract the result into a byte array. */
    b1 = mp_from_bytes_be(ciphertext);
    b2 = rsa_privkey_op(b1, rsa);
    out = snewn(outlen, unsigned char);
    for (i = 0; i < outlen; i++)
        out[i] = mp_get_byte(b2, outlen-1-i);
    mp_free(b1);
    mp_free(b2);

    /* Do the OAEP masking operations, in the reverse order from encryption */
    oaep_mask(h, out+HLEN+1, outlen-HLEN-1, out+1, HLEN);
    oaep_mask(h, out+1, HLEN, out+HLEN+1, outlen-HLEN-1);

    /* Check the leading byte is zero. */
    if (out[0] != 0) {
        sfree(out);
        return NULL;
    }
    /* Check the label hash at position 1+HLEN */
    assert(HLEN <= lenof(labelhash));
    hash_simple(h, PTRLEN_LITERAL(""), labelhash);
    if (memcmp(out + HLEN + 1, labelhash, HLEN)) {
        sfree(out);
        return NULL;
    }
    /* Expect zero bytes followed by a 1 byte */
    for (i = 1 + 2 * HLEN; i < outlen; i++) {
        if (out[i] == 1) {
            i++;  /* skip over the 1 byte */
            break;
        } else if (out[i] != 0) {
            sfree(out);
            return NULL;
        }
    }
    /* And what's left is the input message data, which should be
     * encoded as an ordinary SSH-2 mpint. */
    BinarySource_BARE_INIT(src, out + i, outlen - i);
    b1 = get_mp_ssh2(src);
    sfree(out);
    if (get_err(src) || get_avail(src) != 0) {
        mp_free(b1);
        return NULL;
    }

    /* Success! */
    return b1;
}